

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_deepseek2::llm_build_deepseek2
          (llm_build_deepseek2 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  ulong uVar4;
  ggml_tensor *pgVar5;
  llm_graph_input_attn_kv_unified *plVar6;
  ggml_tensor *pgVar7;
  const_reference pvVar8;
  ggml_tensor *pgVar9;
  undefined8 uVar10;
  long lVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined4 *puVar14;
  int extraout_var;
  undefined8 uVar15;
  ggml_tensor *kq_b;
  ggml_tensor *pgVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int extraout_var_00;
  int64_t iVar19;
  pointer plVar20;
  undefined8 in_RCX;
  ulong uVar21;
  ulong uVar22;
  llm_graph_input_attn_kv_unified *plVar23;
  long in_RSI;
  long in_RDI;
  bool bVar24;
  float fVar25;
  ggml_tensor *ffn_shexp;
  ggml_tensor *moe_out;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Kcur_1;
  ggml_tensor *Qcur_1;
  ggml_tensor *Vcur_1;
  ggml_tensor *k_nope;
  ggml_tensor *kv;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *q_nope_absorbed;
  ggml_tensor *k_pe;
  ggml_tensor *kv_cmpr;
  ggml_tensor *kv_cmpr_pe;
  ggml_tensor *q_pe;
  ggml_tensor *q_nope;
  ggml_tensor *q;
  ggml_tensor *inpSA;
  int il;
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  float attn_factor;
  float kq_scale;
  float mscale;
  uint32_t kv_lora_rank;
  int64_t n_embd_head_qk_nope;
  int64_t n_embd_head_qk_rope;
  int64_t n_embd_head_v;
  int64_t n_embd_head_k;
  bool is_mla;
  bool is_lite;
  ggml_tensor *in_stack_fffffffffffffa68;
  int iVar26;
  int iVar27;
  llm_graph_context *in_stack_fffffffffffffa70;
  ggml_backend_buffer *pgVar28;
  ggml_tensor *in_stack_fffffffffffffa78;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffa80;
  llm_graph_context *this_00;
  ggml_tensor *in_stack_fffffffffffffa88;
  undefined4 uVar30;
  ggml_tensor *pgVar29;
  llm_graph_context *in_stack_fffffffffffffa90;
  llm_graph_context *in_stack_fffffffffffffac0;
  llm_graph_context *in_stack_fffffffffffffad0;
  ggml_tensor *in_stack_fffffffffffffae8;
  ggml_tensor *in_stack_fffffffffffffaf0;
  ggml_tensor *in_stack_fffffffffffffaf8;
  ggml_tensor *in_stack_fffffffffffffb00;
  ggml_tensor *in_stack_fffffffffffffb08;
  ggml_tensor *in_stack_fffffffffffffb10;
  ggml_tensor *in_stack_fffffffffffffb20;
  ggml_tensor *in_stack_fffffffffffffb28;
  ggml_tensor *in_stack_fffffffffffffb30;
  ggml_tensor *in_stack_fffffffffffffb38;
  ggml_tensor *in_stack_fffffffffffffb40;
  ggml_tensor *in_stack_fffffffffffffb48;
  ggml_tensor *in_stack_fffffffffffffb50;
  ggml_tensor *in_stack_fffffffffffffb58;
  ggml_tensor *in_stack_fffffffffffffb60;
  ggml_tensor *in_stack_fffffffffffffb68;
  int64_t n_expert_used;
  llm_ffn_op_type type_op;
  ggml_tensor *in_stack_fffffffffffffb78;
  llm_graph_context *in_stack_fffffffffffffb80;
  ggml_tensor *in_stack_fffffffffffffb90;
  ggml_tensor *in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffc30;
  ggml_tensor *in_stack_fffffffffffffc38;
  ggml_tensor *in_stack_fffffffffffffc40;
  ggml_tensor *in_stack_fffffffffffffc48;
  ggml_tensor *in_stack_fffffffffffffc50;
  llm_graph_input_attn_kv_unified *in_stack_fffffffffffffc58;
  llm_graph_context *in_stack_fffffffffffffc60;
  ggml_tensor *in_stack_fffffffffffffc70;
  ggml_tensor *in_stack_fffffffffffffc78;
  ggml_tensor *in_stack_fffffffffffffc80;
  ggml_tensor *in_stack_fffffffffffffc88;
  llm_graph_input_attn_kv_unified *in_stack_fffffffffffffc90;
  uint local_168;
  uint local_164;
  undefined4 *local_c0;
  ggml_tensor *local_b8;
  uint local_ac;
  ggml_tensor *local_88;
  ggml_tensor *local_80;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffa80,
             (llm_graph_params *)in_stack_fffffffffffffa78);
  iVar1 = *(int *)(*(long *)(in_RDI + 8) + 0x10);
  bVar24 = false;
  if (*(int *)(*(long *)(in_RDI + 8) + 0x34) != 0) {
    bVar24 = *(int *)(*(long *)(in_RDI + 8) + 0x38) != 0;
  }
  if (bVar24) {
    local_164 = *(uint *)(*(long *)(in_RDI + 8) + 0x34);
  }
  else {
    local_164 = *(uint *)(*(long *)(in_RDI + 8) + 0x20);
  }
  uVar4 = (ulong)local_164;
  if (bVar24) {
    local_168 = *(uint *)(*(long *)(in_RDI + 8) + 0x38);
  }
  else {
    local_168 = *(uint *)(*(long *)(in_RDI + 8) + 0x24);
  }
  uVar21 = (ulong)local_168;
  uVar22 = (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x14);
  plVar23 = (llm_graph_input_attn_kv_unified *)(uVar4 - uVar22);
  uVar2 = *(uint *)(*(long *)(in_RDI + 8) + 0x1854);
  logf(1.0 / *(float *)(in_RDI + 0x8c));
  sqrtf((float)uVar4);
  fVar25 = logf(1.0 / *(float *)(in_RDI + 0x8c));
  fVar25 = 1.0 / (fVar25 * 0.1 + 1.0);
  local_88 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  pgVar5 = llm_graph_context::build_inp_pos(in_stack_fffffffffffffad0);
  plVar6 = llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffb10);
  for (local_ac = 0; iVar26 = (int)((ulong)in_stack_fffffffffffffa68 >> 0x20),
      (long)(int)local_ac < *(long *)(in_RDI + 0x28); local_ac = local_ac + 1) {
    local_b8 = local_88;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
               (long)(int)local_ac);
    pgVar7 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                        in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffa70 >> 0x20),
                        (int)in_stack_fffffffffffffa70);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               (char *)in_stack_fffffffffffffa70,iVar26);
    if (iVar1 == 0x1b) {
      uVar15 = *(undefined8 *)(in_RDI + 0xc0);
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      local_c0 = (undefined4 *)ggml_mul_mat(uVar15,pvVar8->wq,pgVar7);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)in_stack_fffffffffffffa70,iVar26);
      pgVar9 = in_stack_fffffffffffffae8;
    }
    else {
      uVar15 = *(undefined8 *)(in_RDI + 0xc0);
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      ggml_mul_mat(uVar15,pvVar8->wq_a,pgVar7);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)in_stack_fffffffffffffa70,iVar26);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)(int)local_ac);
      pgVar9 = llm_graph_context::build_norm
                         (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                          in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                          (llm_norm_type)((ulong)in_stack_fffffffffffffa70 >> 0x20),
                          (int)in_stack_fffffffffffffa70);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)in_stack_fffffffffffffa70,iVar26);
      uVar15 = *(undefined8 *)(in_RDI + 0xc0);
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      local_c0 = (undefined4 *)ggml_mul_mat(uVar15,pvVar8->wq_b,pgVar9);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)in_stack_fffffffffffffa70,iVar26);
      pgVar9 = in_stack_fffffffffffffae8;
    }
    uVar15 = *(undefined8 *)(in_RDI + 0x48);
    uVar13 = *(undefined8 *)(in_RDI + 0xc0);
    iVar26 = *(int *)(in_RDI + 0xa8);
    uVar10 = ggml_row_size(*local_c0,uVar4);
    lVar11 = ggml_row_size(*local_c0,uVar4);
    iVar27 = (int)((ulong)(lVar11 * *(long *)(in_RDI + 0x48)) >> 0x20);
    pgVar28 = (ggml_backend_buffer *)0x0;
    uVar10 = ggml_view_3d(uVar13,local_c0,plVar23,uVar15,(long)iVar26,uVar10);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               (char *)pgVar28,iVar27);
    uVar15 = *(undefined8 *)(in_RDI + 0x48);
    uVar13 = *(undefined8 *)(in_RDI + 0xc0);
    iVar26 = *(int *)(in_RDI + 0xa8);
    uVar12 = ggml_row_size(*local_c0,uVar4);
    lVar11 = ggml_row_size(*local_c0,uVar4);
    iVar27 = (int)((ulong)(lVar11 * *(long *)(in_RDI + 0x48)) >> 0x20);
    pgVar28 = (ggml_backend_buffer *)ggml_row_size(*local_c0,plVar23);
    uVar13 = ggml_view_3d(uVar13,local_c0,uVar22,uVar15,(long)iVar26,uVar12);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               (char *)pgVar28,iVar27);
    uVar15 = *(undefined8 *)(in_RDI + 0xc0);
    pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)(int)local_ac);
    puVar14 = (undefined4 *)ggml_mul_mat(uVar15,pvVar8->wkv_a_mqa,pgVar7);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               (char *)pgVar28,iVar27);
    uVar15 = *(undefined8 *)(in_RDI + 0xc0);
    iVar26 = *(int *)(in_RDI + 0xa8);
    uVar12 = ggml_row_size(*puVar14,uVar2 + uVar22);
    ggml_view_2d(uVar15,puVar14,(ulong)uVar2,(long)iVar26,uVar12,0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               (char *)pgVar28,iVar27);
    uVar15 = *(undefined8 *)(in_RDI + 0xc0);
    iVar26 = *(int *)(in_RDI + 0xa8);
    uVar12 = ggml_row_size(*puVar14,uVar2 + uVar22);
    ggml_row_size(*puVar14,uVar2 + uVar22);
    pgVar28 = (ggml_backend_buffer *)ggml_row_size(*puVar14,uVar2);
    iVar27 = extraout_var;
    uVar15 = ggml_view_3d(uVar15,puVar14,uVar22,1,(long)iVar26,uVar12);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               (char *)pgVar28,iVar27);
    uVar13 = ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                           *(undefined4 *)(in_RDI + 0x90),fVar25,*(undefined4 *)(in_RDI + 0x98),
                           *(undefined4 *)(in_RDI + 0x9c),*(undefined8 *)(in_RDI + 0xc0),uVar13,
                           pgVar5,0,*(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               (char *)pgVar28,iVar27);
    uVar15 = ggml_rope_ext(*(undefined4 *)(in_RDI + 0x88),*(undefined4 *)(in_RDI + 0x8c),
                           *(undefined4 *)(in_RDI + 0x90),fVar25,*(undefined4 *)(in_RDI + 0x98),
                           *(undefined4 *)(in_RDI + 0x9c),*(undefined8 *)(in_RDI + 0xc0),uVar15,
                           pgVar5,0,*(undefined4 *)(in_RDI + 0x30),*(undefined4 *)(in_RDI + 0xb8));
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               (char *)pgVar28,iVar27);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
               (long)(int)local_ac);
    pgVar7 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                        in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                        (llm_norm_type)((ulong)pgVar28 >> 0x20),(int)pgVar28);
    uVar30 = (undefined4)((ulong)in_stack_fffffffffffffa88 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               (char *)pgVar28,iVar27);
    if (bVar24) {
      uVar12 = ggml_permute(*(undefined8 *)(in_RDI + 0xc0),uVar10,0,2,1,3);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar27);
      uVar10 = *(undefined8 *)(in_RDI + 0xc0);
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      uVar10 = ggml_mul_mat(uVar10,pvVar8->wk_b,uVar12);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar27);
      uVar10 = ggml_permute(*(undefined8 *)(in_RDI + 0xc0),uVar10,0,2,1,3);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar27);
      ggml_concat(*(undefined8 *)(in_RDI + 0xc0),uVar13,uVar10,0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar27);
      kq_b = (ggml_tensor *)
             ggml_reshape_3d(*(undefined8 *)(in_RDI + 0xc0),pgVar7,uVar2,1,
                             (long)*(int *)(in_RDI + 0xa8));
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar27);
      pgVar16 = (ggml_tensor *)ggml_concat(*(undefined8 *)(in_RDI + 0xc0),uVar15,kq_b,0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar27);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar27);
      in_stack_fffffffffffffc90 = plVar6;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)(int)local_ac);
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      pgVar7 = pvVar8->wv_b;
      pgVar29 = (ggml_tensor *)CONCAT44(uVar30,local_ac);
      cur_00 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffc80 = kq_b;
      in_stack_fffffffffffffc88 = pgVar16;
      local_80 = llm_graph_context::build_attn
                           (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                            (ggml_cgraph *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                            in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                            in_stack_fffffffffffffc70,in_stack_fffffffffffffc78,kq_b,pgVar16,
                            (float)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                            (int)in_stack_fffffffffffffc90);
      iVar26 = (int)((ulong)pgVar16 >> 0x20);
    }
    else {
      in_stack_fffffffffffffc70 = *(ggml_tensor **)(in_RDI + 0xc0);
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      pgVar7 = (ggml_tensor *)ggml_mul_mat(in_stack_fffffffffffffc70,pvVar8->wkv_b,pgVar7);
      in_stack_fffffffffffffc78 = pgVar7;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar27);
      in_stack_fffffffffffffc40 = *(ggml_tensor **)(in_RDI + 0x48);
      in_stack_fffffffffffffc48 = *(ggml_tensor **)(in_RDI + 0xc0);
      in_stack_fffffffffffffc60 = (llm_graph_context *)(long)*(int *)(in_RDI + 0xa8);
      in_stack_fffffffffffffc50 = pgVar7;
      in_stack_fffffffffffffc58 = plVar23;
      uVar12 = ggml_row_size(pgVar7->type,
                             (long)&(plVar23->super_llm_graph_input_i)._vptr_llm_graph_input_i +
                             uVar21);
      in_stack_fffffffffffffc38 =
           (ggml_tensor *)
           ggml_row_size(pgVar7->type,
                         (long)&(plVar23->super_llm_graph_input_i)._vptr_llm_graph_input_i + uVar21)
      ;
      iVar26 = (int)((ulong)((long)in_stack_fffffffffffffc38 * *(long *)(in_RDI + 0x48)) >> 0x20);
      pgVar28 = (ggml_backend_buffer *)0x0;
      uVar17 = ggml_view_3d(in_stack_fffffffffffffc48,in_stack_fffffffffffffc50,
                            in_stack_fffffffffffffc58,in_stack_fffffffffffffc40,
                            in_stack_fffffffffffffc60,uVar12);
      in_stack_fffffffffffffc30 = uVar17;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar26);
      uVar12 = *(undefined8 *)(in_RDI + 0x48);
      uVar3 = *(undefined8 *)(in_RDI + 0xc0);
      iVar26 = *(int *)(in_RDI + 0xa8);
      uVar18 = ggml_row_size(pgVar7->type,
                             (long)&(plVar23->super_llm_graph_input_i)._vptr_llm_graph_input_i +
                             uVar21);
      lVar11 = ggml_row_size(pgVar7->type,
                             (long)&(plVar23->super_llm_graph_input_i)._vptr_llm_graph_input_i +
                             uVar21);
      iVar27 = (int)((ulong)(lVar11 * *(long *)(in_RDI + 0x48)) >> 0x20);
      pgVar28 = (ggml_backend_buffer *)ggml_row_size(pgVar7->type,plVar23);
      uVar12 = ggml_view_3d(uVar3,pgVar7,uVar21,uVar12,(long)iVar26,uVar18);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar27);
      kq_b = (ggml_tensor *)ggml_cont(*(undefined8 *)(in_RDI + 0xc0),uVar12);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar27);
      ggml_concat(*(undefined8 *)(in_RDI + 0xc0),uVar13,uVar10,0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar27);
      uVar10 = *(undefined8 *)(in_RDI + 0xc0);
      uVar15 = ggml_repeat(uVar10,uVar15,uVar13);
      ggml_concat(uVar10,uVar15,uVar17,0);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)pgVar28,iVar27);
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)(int)local_ac);
      pgVar29 = (ggml_tensor *)CONCAT44(uVar30,local_ac);
      pgVar7 = (ggml_tensor *)0x0;
      cur_00 = (ggml_tensor *)0x0;
      iVar26 = extraout_var_00;
      local_80 = llm_graph_context::build_attn
                           (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,
                            (ggml_cgraph *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                            in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                            in_stack_fffffffffffffc70,in_stack_fffffffffffffc78,
                            in_stack_fffffffffffffc80,in_stack_fffffffffffffc88,
                            (float)((ulong)in_stack_fffffffffffffc30 >> 0x20),
                            (int)in_stack_fffffffffffffc90);
    }
    if ((long)(int)local_ac == *(long *)(in_RDI + 0x28) + -1) {
      pgVar16 = llm_graph_context::build_inp_out_ids(in_stack_fffffffffffffac0);
      in_stack_fffffffffffffb98 = pgVar16;
      local_80 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_80,pgVar16);
      in_stack_fffffffffffffb90 = local_80;
      local_b8 = (ggml_tensor *)ggml_get_rows(*(undefined8 *)(in_RDI + 0xc0),local_88,pgVar16);
    }
    iVar19 = ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_80,local_b8);
    llm_graph_context::cb((llm_graph_context *)pgVar7,cur_00,(char *)kq_b,iVar26);
    n_expert_used = iVar19;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
               (long)(int)local_ac);
    in_stack_fffffffffffffae8 =
         llm_graph_context::build_norm
                   (in_stack_fffffffffffffa90,pgVar29,pgVar7,cur_00,
                    (llm_norm_type)((ulong)kq_b >> 0x20),(int)kq_b);
    pgVar29 = in_stack_fffffffffffffae8;
    llm_graph_context::cb((llm_graph_context *)pgVar7,cur_00,(char *)kq_b,iVar26);
    type_op = (llm_ffn_op_type)pgVar29;
    if (local_ac < *(uint *)(*(long *)(in_RDI + 8) + 0x184c)) {
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      in_stack_fffffffffffffb50 = pvVar8->ffn_up;
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      in_stack_fffffffffffffb58 = pvVar8->ffn_gate;
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      in_stack_fffffffffffffa78 = pvVar8->ffn_down;
      in_stack_fffffffffffffa90 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffa88 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffa80 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffa70 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffa68 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffb60 = (ggml_tensor *)&stack0xfffffffffffffa68;
      local_80 = llm_graph_context::build_ffn
                           ((llm_graph_context *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08
                            ,in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                            in_stack_fffffffffffffaf0,pgVar9,in_stack_fffffffffffffb20,
                            in_stack_fffffffffffffb28,in_stack_fffffffffffffb30,
                            in_stack_fffffffffffffb38,in_stack_fffffffffffffb40,
                            in_stack_fffffffffffffae8,(llm_ffn_op_type)in_stack_fffffffffffffb50,
                            (llm_ffn_gate_type)in_stack_fffffffffffffb58,
                            (int)&stack0xfffffffffffffa68);
      in_stack_fffffffffffffb48 = in_stack_fffffffffffffae8;
      in_stack_fffffffffffffb68 = local_80;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)in_stack_fffffffffffffa70,(int)((ulong)in_stack_fffffffffffffa68 >> 0x20));
      in_stack_fffffffffffffae8 = pgVar9;
    }
    else {
      in_stack_fffffffffffffb10 = in_stack_fffffffffffffae8;
      std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                 (long)(int)local_ac);
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      in_stack_fffffffffffffb20 = pvVar8->ffn_up_exps;
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      in_stack_fffffffffffffb28 = pvVar8->ffn_gate_exps;
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      in_stack_fffffffffffffb30 = pvVar8->ffn_down_exps;
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      iVar26 = (int)((ulong)pvVar8->ffn_exp_probs_b >> 0x20);
      pgVar28 = *(ggml_backend_buffer **)(in_RDI + 0x78);
      pgVar9 = *(ggml_tensor **)(in_RDI + 0x80);
      this_00 = (llm_graph_context *)((ulong)pgVar7 & 0xffffffff00000000);
      in_stack_fffffffffffffb38 = (ggml_tensor *)&stack0xfffffffffffffa68;
      pgVar7 = llm_graph_context::build_moe_ffn
                         ((llm_graph_context *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,
                          in_stack_fffffffffffffb40,(ggml_tensor *)&stack0xfffffffffffffa68,
                          in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                          in_stack_fffffffffffffb60,(int64_t)in_stack_fffffffffffffb68,n_expert_used
                          ,type_op,SUB81((ulong)in_stack_fffffffffffffb20 >> 0x38,0),
                          SUB81((ulong)in_stack_fffffffffffffb20 >> 0x30,0),
                          SUB84(in_stack_fffffffffffffb20,0),
                          (llama_expert_gating_func_type)in_stack_fffffffffffffb90,
                          (int)in_stack_fffffffffffffb98);
      in_stack_fffffffffffffb40 = pgVar7;
      llm_graph_context::cb(this_00,pgVar9,(char *)pgVar28,iVar26);
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      in_stack_fffffffffffffaf0 = pvVar8->ffn_up_shexp;
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      in_stack_fffffffffffffaf8 = pvVar8->ffn_gate_shexp;
      pvVar8 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                         ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                          (long)(int)local_ac);
      in_stack_fffffffffffffa78 = pvVar8->ffn_down_shexp;
      in_stack_fffffffffffffa90 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffa88 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffa80 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffa70 = (llm_graph_context *)0x0;
      in_stack_fffffffffffffa68 = (ggml_tensor *)0x0;
      in_stack_fffffffffffffb00 = (ggml_tensor *)&stack0xfffffffffffffa68;
      pgVar9 = llm_graph_context::build_ffn
                         ((llm_graph_context *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
                          (ggml_tensor *)&stack0xfffffffffffffa68,in_stack_fffffffffffffaf8,
                          in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                          in_stack_fffffffffffffb20,in_stack_fffffffffffffb28,
                          in_stack_fffffffffffffb30,in_stack_fffffffffffffb38,
                          in_stack_fffffffffffffb40,in_stack_fffffffffffffb48,
                          (llm_ffn_op_type)in_stack_fffffffffffffb50,
                          (llm_ffn_gate_type)in_stack_fffffffffffffb58,
                          (int)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb08 = pgVar9;
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)in_stack_fffffffffffffa70,(int)((ulong)in_stack_fffffffffffffa68 >> 0x20));
      local_80 = (ggml_tensor *)ggml_add(*(undefined8 *)(in_RDI + 0xc0),pgVar7,pgVar9);
      llm_graph_context::cb
                ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
                 (char *)in_stack_fffffffffffffa70,(int)((ulong)in_stack_fffffffffffffa68 >> 0x20));
    }
    ggml_add(*(undefined8 *)(in_RDI + 0xc0),local_80,iVar19);
    local_88 = llm_graph_context::build_cvec(in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               (char *)in_stack_fffffffffffffa70,(int)((ulong)in_stack_fffffffffffffa68 >> 0x20));
  }
  pgVar5 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                      in_stack_fffffffffffffa78,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffa70 >> 0x20),
                      (int)in_stack_fffffffffffffa70);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             (char *)in_stack_fffffffffffffa70,iVar26);
  plVar20 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4ee626);
  plVar20->t_embd = pgVar5;
  pgVar5 = (ggml_tensor *)
           ggml_mul_mat(*(undefined8 *)(in_RDI + 0xc0),*(undefined8 *)(in_RSI + 0x1998),pgVar5);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             (char *)in_stack_fffffffffffffa70,iVar26);
  plVar20 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4ee6b5);
  plVar20->t_logits = pgVar5;
  ggml_build_forward_expand(in_RCX,pgVar5);
  return;
}

Assistant:

llm_build_deepseek2(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        bool is_lite = (hparams.n_layer == 27);

        const bool is_mla = (hparams.n_embd_head_k_mla != 0 && hparams.n_embd_head_v_mla != 0);

        // note: these are the actual head sizes you get when treating as MHA or after "decompression" using wv_b for MLA
        const int64_t n_embd_head_k = is_mla ? hparams.n_embd_head_k_mla : hparams.n_embd_head_k;
        const int64_t n_embd_head_v = is_mla ? hparams.n_embd_head_v_mla : hparams.n_embd_head_v;

        const int64_t n_embd_head_qk_rope = hparams.n_rot;
        const int64_t n_embd_head_qk_nope = n_embd_head_k - n_embd_head_qk_rope;

        const uint32_t kv_lora_rank = hparams.n_lora_kv;

        // We have to pre-scale kq_scale and attn_factor to make the YaRN RoPE work correctly.
        // See https://github.com/ggerganov/llama.cpp/discussions/7416 for detailed explanation.
        const float mscale = attn_factor * (1.0f + hparams.rope_yarn_log_mul * logf(1.0f / freq_scale));
        const float kq_scale = 1.0f*mscale*mscale/sqrtf(float(n_embd_head_k));
        const float attn_factor = 1.0f / (1.0f + 0.1f * logf(1.0f / freq_scale));

        ggml_tensor * cur;
        ggml_tensor * inpL;

        // {n_embd, n_tokens}
        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self_attention
            {
                ggml_tensor * q = NULL;
                if (!is_lite) {
                    q = ggml_mul_mat(ctx0, model.layers[il].wq_a, cur);
                    cb(q, "q", il);

                    q = build_norm(q,
                            model.layers[il].attn_q_a_norm, nullptr,
                            LLM_NORM_RMS, il);
                    cb(q, "q", il);

                    q = ggml_mul_mat(ctx0, model.layers[il].wq_b, q);
                    cb(q, "q", il);
                } else {
                    q = ggml_mul_mat(ctx0, model.layers[il].wq, cur);
                    cb(q, "q", il);
                }

                // split into {n_embd_head_qk_nope, n_head, n_tokens}
                ggml_tensor * q_nope = ggml_view_3d(ctx0, q,
                        n_embd_head_qk_nope, n_head, n_tokens,
                        ggml_row_size(q->type, n_embd_head_k),
                        ggml_row_size(q->type, n_embd_head_k) * n_head,
                        0);
                cb(q_nope, "q_nope", il);

                // and {n_embd_head_qk_rope, n_head, n_tokens}
                ggml_tensor * q_pe = ggml_view_3d(ctx0, q,
                        n_embd_head_qk_rope, n_head, n_tokens,
                        ggml_row_size(q->type, n_embd_head_k),
                        ggml_row_size(q->type, n_embd_head_k) * n_head,
                        ggml_row_size(q->type, n_embd_head_qk_nope));
                cb(q_pe, "q_pe", il);

                ggml_tensor * kv_cmpr_pe = ggml_mul_mat(ctx0, model.layers[il].wkv_a_mqa, cur);
                cb(kv_cmpr_pe, "kv_cmpr_pe", il);

                // split into {kv_lora_rank, n_tokens}
                ggml_tensor * kv_cmpr = ggml_view_2d(ctx0, kv_cmpr_pe,
                        kv_lora_rank, n_tokens,
                        ggml_row_size(kv_cmpr_pe->type, kv_lora_rank + n_embd_head_qk_rope),
                        0);
                cb(kv_cmpr, "kv_cmpr", il);

                // and {n_embd_head_qk_rope, 1, n_tokens}
                ggml_tensor * k_pe = ggml_view_3d(ctx0, kv_cmpr_pe,
                        n_embd_head_qk_rope, 1, n_tokens,
                        ggml_row_size(kv_cmpr_pe->type, kv_lora_rank + n_embd_head_qk_rope),
                        ggml_row_size(kv_cmpr_pe->type, kv_lora_rank + n_embd_head_qk_rope),
                        ggml_row_size(kv_cmpr_pe->type, kv_lora_rank));
                cb(k_pe, "k_pe", il);

                q_pe = ggml_rope_ext(ctx0, q_pe, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                );
                cb(q_pe, "q_pe", il);

                k_pe = ggml_rope_ext(ctx0, k_pe, inp_pos, nullptr,
                        n_rot, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                );
                cb(k_pe, "k_pe", il);

                kv_cmpr = build_norm(kv_cmpr,
                        model.layers[il].attn_kv_a_norm, nullptr,
                        LLM_NORM_RMS, il);
                cb(kv_cmpr, "kv_cmpr", il);

                if (is_mla) {
                    // {n_embd_head_qk_nope, n_tokens, n_head}
                    q_nope = ggml_permute(ctx0, q_nope, 0, 2, 1, 3);
                    cb(q_nope, "q_nope_perm", il);

                    // {n_embd_head_qk_nope, kv_lora_rank, n_head} x {n_embd_head_qk_nope, n_tokens, n_head}
                    ggml_tensor * q_nope_absorbed = ggml_mul_mat(ctx0, model.layers[il].wk_b, q_nope);
                    cb(q_nope_absorbed, "q_nope_absorbed", il);

                    // {kv_lora_rank, n_head, n_tokens}
                    q_nope_absorbed = ggml_permute(ctx0, q_nope_absorbed, 0, 2, 1, 3);
                    cb(q_nope_absorbed, "q_nope_absorbed_perm", il);

                    // {n_embd_head_qk_rope + kv_lora_rank, n_head, n_tokens}
                    // note: rope must go first for in-place context shifting in build_rope_shift()
                    ggml_tensor * Qcur = ggml_concat(ctx0, q_pe, q_nope_absorbed, 0);
                    cb(Qcur, "Qcur", il);

                    kv_cmpr = ggml_reshape_3d(ctx0, kv_cmpr, kv_lora_rank, 1, n_tokens);
                    cb(kv_cmpr, "kv_cmpr_reshape", il);

                    // {n_embd_head_qk_rope + kv_lora_rank, 1, n_tokens}
                    ggml_tensor * Kcur = ggml_concat(ctx0, k_pe, kv_cmpr, 0);
                    cb(Kcur, "Kcur", il);

                    // {kv_lora_rank, 1, n_tokens}
                    ggml_tensor * Vcur = kv_cmpr;
                    cb(Vcur, "Vcur", il);

                    // note: MLA with the absorption optimzation converts into MQA (ie: GQA with 1 group)
                    cur = build_attn(inp_attn, gf,
                            model.layers[il].wo, NULL,
                            Qcur, Kcur, Vcur, nullptr, model.layers[il].wv_b, kq_scale, il);
                } else {
                    ggml_tensor * kv = ggml_mul_mat(ctx0, model.layers[il].wkv_b, kv_cmpr);
                    cb(kv, "kv", il);

                    // split into {n_embd_head_qk_nope, n_head, n_tokens}
                    ggml_tensor * k_nope = ggml_view_3d(ctx0, kv,
                            n_embd_head_qk_nope, n_head, n_tokens,
                            ggml_row_size(kv->type, n_embd_head_qk_nope + n_embd_head_v),
                            ggml_row_size(kv->type, n_embd_head_qk_nope + n_embd_head_v) * n_head,
                            0);
                    cb(k_nope, "k_nope_view", il);

                    // and {n_embd_head_v, n_head, n_tokens}
                    ggml_tensor * Vcur = ggml_view_3d(ctx0, kv,
                            n_embd_head_v, n_head, n_tokens,
                            ggml_row_size(kv->type, n_embd_head_qk_nope + n_embd_head_v),
                            ggml_row_size(kv->type, n_embd_head_qk_nope + n_embd_head_v) * n_head,
                            ggml_row_size(kv->type, n_embd_head_qk_nope));
                    cb(Vcur, "Vcur_view", il);

                    Vcur = ggml_cont(ctx0, Vcur);
                    cb(Vcur, "Vcur_cont", il);

                    // note: rope must go first for in-place context shifting in build_rope_shift()
                    ggml_tensor * Qcur = ggml_concat(ctx0, q_pe, q_nope, 0);
                    cb(Qcur, "Qcur", il);

                    ggml_tensor * Kcur = ggml_concat(ctx0, ggml_repeat(ctx0, k_pe, q_pe), k_nope, 0);
                    cb(Kcur, "Kcur", il);

                    // note: MLA without the absorption optimization converts into MHA (ie: GQA with full n_head groups)
                    cur = build_attn(inp_attn, gf,
                            model.layers[il].wo, NULL,
                            Qcur, Kcur, Vcur, nullptr, nullptr, kq_scale, il);
                }
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            if ((uint32_t) il < hparams.n_layer_dense_lead) {
                cur = build_ffn(cur,
                        model.layers[il].ffn_up,   NULL, NULL,
                        model.layers[il].ffn_gate, NULL, NULL,
                        model.layers[il].ffn_down, NULL, NULL,
                        NULL,
                        LLM_FFN_SILU, LLM_FFN_PAR, il);
                cb(cur, "ffn_out", il);
            } else {
                // MoE branch
                ggml_tensor * moe_out =
                    build_moe_ffn(cur,
                            model.layers[il].ffn_gate_inp,
                            model.layers[il].ffn_up_exps,
                            model.layers[il].ffn_gate_exps,
                            model.layers[il].ffn_down_exps,
                            model.layers[il].ffn_exp_probs_b,
                            n_expert, n_expert_used,
                            LLM_FFN_SILU, hparams.expert_weights_norm,
                            true, hparams.expert_weights_scale,
                            (llama_expert_gating_func_type) hparams.expert_gating_func,
                            il);
                cb(moe_out, "ffn_moe_out", il);

                // FFN shared expert
                {
                    ggml_tensor * ffn_shexp = build_ffn(cur,
                            model.layers[il].ffn_up_shexp,   NULL, NULL,
                            model.layers[il].ffn_gate_shexp, NULL, NULL,
                            model.layers[il].ffn_down_shexp, NULL, NULL,
                            NULL,
                            LLM_FFN_SILU, LLM_FFN_PAR, il);
                    cb(ffn_shexp, "ffn_shexp", il);

                    cur = ggml_add(ctx0, moe_out, ffn_shexp);
                    cb(cur, "ffn_out", il);
                }
            }

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = ggml_mul_mat(ctx0, model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }